

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct64_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i alVar12;
  undefined1 (*pauVar13) [32];
  undefined1 *puVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m256i cospim32;
  __m256i cospi32;
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i rnding;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi48;
  __m256i cospi16;
  undefined1 local_c00 [32];
  int local_b20;
  int iStack_b1c;
  int iStack_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int iStack_b08;
  int iStack_b04;
  int local_b00;
  int iStack_afc;
  int iStack_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int iStack_ae8;
  int iStack_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  __m256i local_a80;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  int local_9c0;
  int iStack_9bc;
  int iStack_9b8;
  int iStack_9b4;
  int iStack_9b0;
  int iStack_9ac;
  int iStack_9a8;
  int iStack_9a4;
  int local_9a0;
  int iStack_99c;
  int iStack_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int iStack_988;
  int iStack_984;
  int local_980;
  int iStack_97c;
  int iStack_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int iStack_968;
  int iStack_964;
  int local_960;
  int iStack_95c;
  int iStack_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int iStack_948;
  int iStack_944;
  int local_940;
  int iStack_93c;
  int iStack_938;
  int iStack_934;
  int iStack_930;
  int iStack_92c;
  int iStack_928;
  int iStack_924;
  int local_920;
  int iStack_91c;
  int iStack_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  int iStack_908;
  int iStack_904;
  int local_900;
  int iStack_8fc;
  int iStack_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int iStack_8e8;
  int iStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  __m256i local_860;
  __m256i local_840;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar18 = (long)bit;
  lVar19 = lVar18 * 0x100;
  local_980 = 1 << ((char)bit - 1U & 0x1f);
  iVar23 = bd + (uint)(do_cols == 0) * 2;
  local_9c0 = 0x8000;
  if (0xf < iVar23 + 6) {
    local_9c0 = 1 << ((char)iVar23 + 5U & 0x1f);
  }
  local_9a0 = -local_9c0;
  local_9c0 = local_9c0 + -1;
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][1];
  auVar26._4_4_ = iVar23;
  auVar26._0_4_ = iVar23;
  auVar26._8_4_ = iVar23;
  auVar26._12_4_ = iVar23;
  auVar26._16_4_ = iVar23;
  auVar26._20_4_ = iVar23;
  auVar26._24_4_ = iVar23;
  auVar26._28_4_ = iVar23;
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][5];
  auVar28._4_4_ = iVar23;
  auVar28._0_4_ = iVar23;
  auVar28._8_4_ = iVar23;
  auVar28._12_4_ = iVar23;
  auVar28._16_4_ = iVar23;
  auVar28._20_4_ = iVar23;
  auVar28._24_4_ = iVar23;
  auVar28._28_4_ = iVar23;
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][7];
  auVar33._4_4_ = iVar23;
  auVar33._0_4_ = iVar23;
  auVar33._8_4_ = iVar23;
  auVar33._12_4_ = iVar23;
  auVar33._16_4_ = iVar23;
  auVar33._20_4_ = iVar23;
  auVar33._24_4_ = iVar23;
  auVar33._28_4_ = iVar23;
  iVar23 = LoadMaskz2[lVar18 * 8 + 5][1];
  auVar41._4_4_ = iVar23;
  auVar41._0_4_ = iVar23;
  auVar41._8_4_ = iVar23;
  auVar41._12_4_ = iVar23;
  auVar41._16_4_ = iVar23;
  auVar41._20_4_ = iVar23;
  auVar41._24_4_ = iVar23;
  auVar41._28_4_ = iVar23;
  local_c00._4_4_ = LoadMaskz2[lVar18 * 8 + 5][3];
  local_c00._0_4_ = local_c00._4_4_;
  local_c00._8_4_ = local_c00._4_4_;
  local_c00._12_4_ = local_c00._4_4_;
  local_c00._16_4_ = local_c00._4_4_;
  local_c00._20_4_ = local_c00._4_4_;
  local_c00._24_4_ = local_c00._4_4_;
  local_c00._28_4_ = local_c00._4_4_;
  iVar23 = LoadMaskz2[lVar18 * 8 + 5][7];
  auVar50._4_4_ = iVar23;
  auVar50._0_4_ = iVar23;
  auVar50._8_4_ = iVar23;
  auVar50._12_4_ = iVar23;
  auVar50._16_4_ = iVar23;
  auVar50._20_4_ = iVar23;
  auVar50._24_4_ = iVar23;
  auVar50._28_4_ = iVar23;
  local_900 = LoadMaskz2[lVar18 * 8 + 6][0];
  local_b00 = *(int *)(&DAT_00431cc0 + lVar18 * 0x20);
  local_920 = *(int *)(&DAT_00431d00 + lVar19);
  uVar1 = *(undefined4 *)(&DAT_00431d1c + lVar19);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00431d2c + lVar19);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  local_940 = -local_900;
  local_b20 = -local_b00;
  local_960 = -local_920;
  alVar12 = *in;
  pauVar13 = &local_380;
  local_860[0] = alVar12[0];
  local_860[1] = alVar12[1];
  local_860[2] = alVar12[2];
  local_860[3] = alVar12[3];
  uVar1 = *(undefined4 *)(&DAT_00431d3c + lVar19);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar63._16_4_ = uVar1;
  auVar63._20_4_ = uVar1;
  auVar63._24_4_ = uVar1;
  auVar63._28_4_ = uVar1;
  iVar23 = -*(int *)(&DAT_00431d04 + lVar19);
  auVar2 = vpmulld_avx2(auVar26,(undefined1  [32])in[1]);
  auVar3 = vpmulld_avx2(auVar63,(undefined1  [32])in[1]);
  auVar64._4_4_ = iVar23;
  auVar64._0_4_ = iVar23;
  auVar64._8_4_ = iVar23;
  auVar64._12_4_ = iVar23;
  auVar64._16_4_ = iVar23;
  auVar64._20_4_ = iVar23;
  auVar64._24_4_ = iVar23;
  auVar64._28_4_ = iVar23;
  iVar23 = -*(int *)(&DAT_00431d14 + lVar19);
  auVar26 = vpmulld_avx2(auVar64,(undefined1  [32])in[0xf]);
  auVar29 = vpmulld_avx2(auVar50,(undefined1  [32])in[0xf]);
  iVar15 = -*(int *)(&DAT_00431d24 + lVar19);
  auVar51._4_4_ = iVar23;
  auVar51._0_4_ = iVar23;
  auVar51._8_4_ = iVar23;
  auVar51._12_4_ = iVar23;
  auVar51._16_4_ = iVar23;
  auVar51._20_4_ = iVar23;
  auVar51._24_4_ = iVar23;
  auVar51._28_4_ = iVar23;
  auVar30 = vpmulld_avx2(auVar41,(undefined1  [32])in[9]);
  auVar31 = vpmulld_avx2(auVar54,(undefined1  [32])in[9]);
  auVar62._4_4_ = iVar15;
  auVar62._0_4_ = iVar15;
  auVar62._8_4_ = iVar15;
  auVar62._12_4_ = iVar15;
  auVar62._16_4_ = iVar15;
  auVar62._20_4_ = iVar15;
  auVar62._24_4_ = iVar15;
  auVar62._28_4_ = iVar15;
  iVar23 = -*(int *)(&DAT_00431d34 + lVar19);
  auVar32 = vpmulld_avx2(auVar62,(undefined1  [32])in[7]);
  auVar27 = vpmulld_avx2(auVar33,(undefined1  [32])in[7]);
  auVar28 = vpmulld_avx2(auVar28,(undefined1  [32])in[5]);
  auVar33 = vpmulld_avx2(auVar38,(undefined1  [32])in[5]);
  auVar7._4_4_ = local_980;
  auVar7._0_4_ = local_980;
  auVar7._8_4_ = local_980;
  auVar7._12_4_ = local_980;
  auVar7._16_4_ = local_980;
  auVar7._20_4_ = local_980;
  auVar7._24_4_ = local_980;
  auVar7._28_4_ = local_980;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_80 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar34._4_4_ = iVar23;
  auVar34._0_4_ = iVar23;
  auVar34._8_4_ = iVar23;
  auVar34._12_4_ = iVar23;
  auVar34._16_4_ = iVar23;
  auVar34._20_4_ = iVar23;
  auVar34._24_4_ = iVar23;
  auVar34._28_4_ = iVar23;
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_460 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2(auVar26,auVar7);
  auVar67 = ZEXT416((uint)bit);
  local_400 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar29,auVar7);
  local_e0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar30,auVar7);
  local_100 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar31,auVar7);
  local_3e0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar32,auVar7);
  auVar67 = ZEXT416((uint)bit);
  local_380 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar27,auVar7);
  local_160 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar28,auVar7);
  local_180 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar33,auVar7);
  local_360 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2(auVar51,(undefined1  [32])in[0xb]);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_300 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xb],local_c00);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_1e0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[3],auVar34);
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][3];
  auVar39._4_4_ = iVar23;
  auVar39._0_4_ = iVar23;
  auVar39._8_4_ = iVar23;
  auVar39._12_4_ = iVar23;
  auVar39._16_4_ = iVar23;
  auVar39._20_4_ = iVar23;
  auVar39._24_4_ = iVar23;
  auVar39._28_4_ = iVar23;
  auVar3 = vpmulld_avx2((undefined1  [32])in[3],auVar39);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_280 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  auVar68 = ZEXT416((uint)bit);
  local_260 = vpsrad_avx2(auVar2,auVar68);
  iVar23 = LoadMaskz2[lVar18 * 8 + 5][5];
  auVar29._4_4_ = iVar23;
  auVar29._0_4_ = iVar23;
  auVar29._8_4_ = iVar23;
  auVar29._12_4_ = iVar23;
  auVar29._16_4_ = iVar23;
  auVar29._20_4_ = iVar23;
  auVar29._24_4_ = iVar23;
  auVar29._28_4_ = iVar23;
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xd],auVar29);
  uVar1 = *(undefined4 *)(&DAT_00431d0c + lVar19);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xd],auVar40);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_200 = vpsrad_avx2(auVar2,auVar68);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_2e0 = vpsrad_avx2(auVar2,auVar68);
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][2];
  auVar35._4_4_ = iVar23;
  auVar35._0_4_ = iVar23;
  auVar35._8_4_ = iVar23;
  auVar35._12_4_ = iVar23;
  auVar35._16_4_ = iVar23;
  auVar35._20_4_ = iVar23;
  auVar35._24_4_ = iVar23;
  auVar35._28_4_ = iVar23;
  auVar2 = vpmulld_avx2((undefined1  [32])in[2],auVar35);
  uVar1 = *(undefined4 *)(&DAT_00431d38 + lVar19);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[2],auVar42);
  iVar23 = -*(int *)(&DAT_00431d08 + lVar19);
  auVar43._4_4_ = iVar23;
  auVar43._0_4_ = iVar23;
  auVar43._8_4_ = iVar23;
  auVar43._12_4_ = iVar23;
  auVar43._16_4_ = iVar23;
  auVar43._20_4_ = iVar23;
  auVar43._24_4_ = iVar23;
  auVar43._28_4_ = iVar23;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_480 = vpsrad_avx2(auVar2,auVar68);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_8c0 = vpsrad_avx2(auVar2,auVar68);
  local_660 = local_8c0;
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xe],auVar43);
  iVar23 = LoadMaskz2[lVar18 * 8 + 5][6];
  auVar44._4_4_ = iVar23;
  auVar44._0_4_ = iVar23;
  auVar44._8_4_ = iVar23;
  auVar44._12_4_ = iVar23;
  auVar44._16_4_ = iVar23;
  auVar44._20_4_ = iVar23;
  auVar44._24_4_ = iVar23;
  auVar44._28_4_ = iVar23;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xe],auVar44);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_600 = vpsrad_avx2(auVar2,auVar68);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_4e0 = vpsrad_avx2(auVar2,auVar68);
  iVar23 = LoadMaskz2[lVar18 * 8 + 5][2];
  auVar36._4_4_ = iVar23;
  auVar36._0_4_ = iVar23;
  auVar36._8_4_ = iVar23;
  auVar36._12_4_ = iVar23;
  auVar36._16_4_ = iVar23;
  auVar36._20_4_ = iVar23;
  auVar36._24_4_ = iVar23;
  auVar36._28_4_ = iVar23;
  auVar2 = vpmulld_avx2((undefined1  [32])in[10],auVar36);
  uVar1 = *(undefined4 *)(&DAT_00431d18 + lVar19);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[10],auVar45);
  iVar23 = -*(int *)(&DAT_00431d28 + lVar19);
  auVar30._4_4_ = iVar23;
  auVar30._0_4_ = iVar23;
  auVar30._8_4_ = iVar23;
  auVar30._12_4_ = iVar23;
  auVar30._16_4_ = iVar23;
  auVar30._20_4_ = iVar23;
  auVar30._24_4_ = iVar23;
  auVar30._28_4_ = iVar23;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_500 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_5e0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[6],auVar30);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_580 = vpsrad_avx2(auVar2,auVar67);
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][6];
  auVar31._4_4_ = iVar23;
  auVar31._0_4_ = iVar23;
  auVar31._8_4_ = iVar23;
  auVar31._12_4_ = iVar23;
  auVar31._16_4_ = iVar23;
  auVar31._20_4_ = iVar23;
  auVar31._24_4_ = iVar23;
  auVar31._28_4_ = iVar23;
  auVar2 = vpmulld_avx2((undefined1  [32])in[6],auVar31);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_560 = vpsrad_avx2(auVar2,auVar67);
  iVar23 = LoadMaskz2[lVar18 * 8 + 4][4];
  local_8a0._4_4_ = iVar23;
  local_8a0._0_4_ = iVar23;
  local_8a0._8_4_ = iVar23;
  local_8a0._12_4_ = iVar23;
  local_8a0._16_4_ = iVar23;
  local_8a0._20_4_ = iVar23;
  local_8a0._24_4_ = iVar23;
  local_8a0._28_4_ = iVar23;
  iVar15 = LoadMaskz2[lVar18 * 8 + 5][4];
  local_880._4_4_ = iVar15;
  local_880._0_4_ = iVar15;
  local_880._8_4_ = iVar15;
  local_880._12_4_ = iVar15;
  local_880._16_4_ = iVar15;
  local_880._20_4_ = iVar15;
  local_880._24_4_ = iVar15;
  local_880._28_4_ = iVar15;
  iVar16 = *(int *)(&DAT_00431d10 + lVar19);
  iVar21 = *(int *)(&DAT_00431d30 + lVar19);
  local_8e0._4_4_ = iVar21;
  local_8e0._0_4_ = iVar21;
  local_8e0._8_4_ = iVar21;
  local_8e0._12_4_ = iVar21;
  local_8e0._16_4_ = iVar21;
  local_8e0._20_4_ = iVar21;
  local_8e0._24_4_ = iVar21;
  local_8e0._28_4_ = iVar21;
  iVar25 = -iVar16;
  auVar65._4_4_ = iVar25;
  auVar65._0_4_ = iVar25;
  auVar65._8_4_ = iVar25;
  auVar65._12_4_ = iVar25;
  auVar65._16_4_ = iVar25;
  auVar65._20_4_ = iVar25;
  auVar65._24_4_ = iVar25;
  auVar65._28_4_ = iVar25;
  auVar2 = vpmulld_avx2((undefined1  [32])in[4],local_8a0);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_680 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[4],local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_760 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xc],auVar65);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_700 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xc],local_880);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_6e0 = vpsrad_avx2(auVar2,auVar67);
  iVar23 = -iVar23;
  auVar58._4_4_ = iVar23;
  auVar58._0_4_ = iVar23;
  auVar58._8_4_ = iVar23;
  auVar58._12_4_ = iVar23;
  auVar58._16_4_ = iVar23;
  auVar58._20_4_ = iVar23;
  auVar58._24_4_ = iVar23;
  auVar58._28_4_ = iVar23;
  auVar2 = vpmulld_avx2(auVar58,local_460);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  auVar3 = vpmulld_avx2(local_8e0,local_80);
  local_ae0 = vpaddd_avx2(auVar2,auVar3);
  iVar21 = -iVar21;
  auVar46._4_4_ = iVar21;
  auVar46._0_4_ = iVar21;
  auVar46._8_4_ = iVar21;
  auVar46._12_4_ = iVar21;
  auVar46._16_4_ = iVar21;
  auVar46._20_4_ = iVar21;
  auVar46._24_4_ = iVar21;
  auVar46._28_4_ = iVar21;
  auVar3 = vpmulld_avx2(local_400,auVar46);
  auVar2 = vpmulld_avx2(local_e0,auVar58);
  auVar2 = vpaddd_avx2(auVar7,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  iVar23 = LoadMaskz2[lVar18 * 8 + 7][4];
  auVar52._4_4_ = iVar23;
  auVar52._0_4_ = iVar23;
  auVar52._8_4_ = iVar23;
  auVar52._12_4_ = iVar23;
  auVar52._16_4_ = iVar23;
  auVar52._20_4_ = iVar23;
  auVar52._24_4_ = iVar23;
  auVar52._28_4_ = iVar23;
  iVar21 = *(int *)(&DAT_00431cd0 + lVar18 * 0x20);
  iVar25 = -iVar21;
  auVar60._4_4_ = iVar25;
  auVar60._0_4_ = iVar25;
  auVar60._8_4_ = iVar25;
  auVar60._12_4_ = iVar25;
  auVar60._16_4_ = iVar25;
  auVar60._20_4_ = iVar25;
  auVar60._24_4_ = iVar25;
  auVar60._28_4_ = iVar25;
  auVar3 = vpmulld_avx2(local_3e0,auVar60);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar26 = vpmulld_avx2(local_100,auVar52);
  auVar3 = vpaddd_avx2(auVar3,auVar26);
  iVar23 = -iVar23;
  auVar48._4_4_ = iVar23;
  auVar48._0_4_ = iVar23;
  auVar48._8_4_ = iVar23;
  auVar48._12_4_ = iVar23;
  auVar48._16_4_ = iVar23;
  auVar48._20_4_ = iVar23;
  auVar48._24_4_ = iVar23;
  auVar48._28_4_ = iVar23;
  auVar29 = vpmulld_avx2(local_380,auVar48);
  auVar26 = vpmulld_avx2(local_160,auVar60);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  auVar30 = vpmulld_avx2(local_380,auVar60);
  auVar29 = vpmulld_avx2(local_160,auVar52);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  local_140 = vpsrad_avx2(auVar29,auVar67);
  auVar29 = vpmulld_avx2(local_3e0,auVar52);
  auVar55._4_4_ = iVar21;
  auVar55._0_4_ = iVar21;
  auVar55._8_4_ = iVar21;
  auVar55._12_4_ = iVar21;
  auVar55._16_4_ = iVar21;
  auVar55._20_4_ = iVar21;
  auVar55._24_4_ = iVar21;
  auVar55._28_4_ = iVar21;
  auVar30 = vpmulld_avx2(local_100,auVar55);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_120 = vpsrad_avx2(auVar29,auVar67);
  auVar30 = vpmulld_avx2(local_400,auVar58);
  auVar29 = vpmulld_avx2(local_e0,local_8e0);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_c0 = vpsrad_avx2(auVar29,auVar67);
  auVar29 = vpmulld_avx2(local_8e0,local_460);
  auVar30 = vpmulld_avx2(local_8a0,local_80);
  iVar23 = LoadMaskz2[lVar18 * 8 + 6][4];
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_a0 = vpsrad_avx2(auVar29,auVar67);
  iVar21 = *(int *)(&DAT_00431cf0 + lVar18 * 0x20);
  auVar53._4_4_ = iVar21;
  auVar53._0_4_ = iVar21;
  auVar53._8_4_ = iVar21;
  auVar53._12_4_ = iVar21;
  auVar53._16_4_ = iVar21;
  auVar53._20_4_ = iVar21;
  auVar53._24_4_ = iVar21;
  auVar53._28_4_ = iVar21;
  iVar25 = -iVar23;
  local_440 = vpsrad_avx2(local_ae0,auVar67);
  auVar56._4_4_ = iVar25;
  auVar56._0_4_ = iVar25;
  auVar56._8_4_ = iVar25;
  auVar56._12_4_ = iVar25;
  auVar56._16_4_ = iVar25;
  auVar56._20_4_ = iVar25;
  auVar56._24_4_ = iVar25;
  auVar56._28_4_ = iVar25;
  local_420 = vpsrad_avx2(auVar2,auVar67);
  local_3c0 = vpsrad_avx2(auVar3,auVar67);
  local_3a0 = vpsrad_avx2(auVar26,auVar67);
  iVar21 = -iVar21;
  auVar2 = vpmulld_avx2(local_360,auVar56);
  auVar3 = vpmulld_avx2(auVar53,local_180);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar47._4_4_ = iVar21;
  auVar47._0_4_ = iVar21;
  auVar47._8_4_ = iVar21;
  auVar47._12_4_ = iVar21;
  auVar47._16_4_ = iVar21;
  auVar47._20_4_ = iVar21;
  auVar47._24_4_ = iVar21;
  auVar47._28_4_ = iVar21;
  auVar3 = vpmulld_avx2(local_300,auVar47);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar26 = vpmulld_avx2(local_1e0,auVar56);
  auVar3 = vpaddd_avx2(auVar3,auVar26);
  auVar26 = vpmulld_avx2(local_200,local_880);
  auVar26 = vpaddd_avx2(auVar7,auVar26);
  auVar29 = vpmulld_avx2(local_2e0,auVar65);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  iVar15 = -iVar15;
  auVar66._4_4_ = iVar15;
  auVar66._0_4_ = iVar15;
  auVar66._8_4_ = iVar15;
  auVar66._12_4_ = iVar15;
  auVar66._16_4_ = iVar15;
  auVar66._20_4_ = iVar15;
  auVar66._24_4_ = iVar15;
  auVar66._28_4_ = iVar15;
  auVar29 = vpmulld_avx2(local_280,auVar66);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar30 = vpmulld_avx2(local_260,auVar65);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  auVar31 = vpmulld_avx2(local_280,auVar65);
  auVar30 = vpmulld_avx2(local_260,local_880);
  auVar30 = vpaddd_avx2(auVar7,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  local_240 = vpsrad_avx2(auVar30,auVar67);
  auVar30 = vpmulld_avx2(local_2e0,local_880);
  auVar32._4_4_ = iVar16;
  auVar32._0_4_ = iVar16;
  auVar32._8_4_ = iVar16;
  auVar32._12_4_ = iVar16;
  auVar32._16_4_ = iVar16;
  auVar32._20_4_ = iVar16;
  auVar32._24_4_ = iVar16;
  auVar32._28_4_ = iVar16;
  auVar31 = vpmulld_avx2(local_200,auVar32);
  auVar30 = vpaddd_avx2(auVar30,auVar7);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_220 = vpsrad_avx2(auVar30,auVar67);
  auVar31 = vpmulld_avx2(local_300,auVar56);
  iVar15 = LoadMaskz2[lVar18 * 8 + 5][0];
  iVar16 = LoadMaskz2[lVar18 * 8 + 7][0];
  iVar21 = *(int *)(&DAT_00431ce0 + lVar18 * 0x20);
  iVar25 = *(int *)(&DAT_00431d20 + lVar19);
  auVar30 = vpmulld_avx2(local_1e0,auVar53);
  auVar30 = vpaddd_avx2(auVar7,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  iVar22 = -iVar15;
  local_1c0 = vpsrad_avx2(auVar30,auVar67);
  auVar49._4_4_ = iVar23;
  auVar49._0_4_ = iVar23;
  auVar49._8_4_ = iVar23;
  auVar49._12_4_ = iVar23;
  auVar49._16_4_ = iVar23;
  auVar49._20_4_ = iVar23;
  auVar49._24_4_ = iVar23;
  auVar49._28_4_ = iVar23;
  auVar30 = vpmulld_avx2(auVar53,local_360);
  iVar24 = -iVar21;
  auVar31 = vpmulld_avx2(auVar49,local_180);
  auVar30 = vpaddd_avx2(auVar30,auVar7);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_1a0 = vpsrad_avx2(auVar30,auVar67);
  iVar23 = -iVar25;
  auVar37._4_4_ = iVar15;
  auVar37._0_4_ = iVar15;
  auVar37._8_4_ = iVar15;
  auVar37._12_4_ = iVar15;
  auVar37._16_4_ = iVar15;
  auVar37._20_4_ = iVar15;
  auVar37._24_4_ = iVar15;
  auVar37._28_4_ = iVar15;
  local_340 = vpsrad_avx2(auVar2,auVar67);
  auVar57._4_4_ = iVar16;
  auVar57._0_4_ = iVar16;
  auVar57._8_4_ = iVar16;
  auVar57._12_4_ = iVar16;
  auVar57._16_4_ = iVar16;
  auVar57._20_4_ = iVar16;
  auVar57._24_4_ = iVar16;
  auVar57._28_4_ = iVar16;
  auVar59._4_4_ = iVar25;
  auVar59._0_4_ = iVar25;
  auVar59._8_4_ = iVar25;
  auVar59._12_4_ = iVar25;
  auVar59._16_4_ = iVar25;
  auVar59._20_4_ = iVar25;
  auVar59._24_4_ = iVar25;
  auVar59._28_4_ = iVar25;
  local_a00._4_4_ = iVar22;
  local_a00._0_4_ = iVar22;
  local_a00._8_4_ = iVar22;
  local_a00._12_4_ = iVar22;
  local_a00._16_4_ = iVar22;
  local_a00._20_4_ = iVar22;
  local_a00._24_4_ = iVar22;
  local_a00._28_4_ = iVar22;
  auVar61._4_4_ = iVar24;
  auVar61._0_4_ = iVar24;
  auVar61._8_4_ = iVar24;
  auVar61._12_4_ = iVar24;
  auVar61._16_4_ = iVar24;
  auVar61._20_4_ = iVar24;
  auVar61._24_4_ = iVar24;
  auVar61._28_4_ = iVar24;
  local_320 = vpsrad_avx2(auVar3,auVar67);
  local_2c0 = vpsrad_avx2(auVar26,auVar67);
  local_a40._4_4_ = iVar23;
  local_a40._0_4_ = iVar23;
  local_a40._8_4_ = iVar23;
  local_a40._12_4_ = iVar23;
  local_a40._16_4_ = iVar23;
  local_a40._20_4_ = iVar23;
  local_a40._24_4_ = iVar23;
  local_a40._28_4_ = iVar23;
  local_2a0 = vpsrad_avx2(auVar29,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[8],auVar37);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_780 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpmulld_avx2((undefined1  [32])in[8],auVar59);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_7e0 = vpsrad_avx2(auVar2,auVar67);
  local_740 = local_760;
  local_720 = local_700;
  local_6c0 = local_6e0;
  local_6a0 = local_680;
  auVar3 = vpmulld_avx2(local_8c0,local_a00);
  auVar2 = vpmulld_avx2(local_480,auVar59);
  auVar2 = vpaddd_avx2(auVar7,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_600,local_a40);
  auVar26 = vpmulld_avx2(local_4e0,local_a00);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar3 = vpaddd_avx2(auVar26,auVar3);
  auVar26 = vpmulld_avx2(local_500,auVar57);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar29 = vpmulld_avx2(local_5e0,auVar61);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  iVar16 = -iVar16;
  auVar27._4_4_ = iVar16;
  auVar27._0_4_ = iVar16;
  auVar27._8_4_ = iVar16;
  auVar27._12_4_ = iVar16;
  auVar27._16_4_ = iVar16;
  auVar27._20_4_ = iVar16;
  auVar27._24_4_ = iVar16;
  auVar27._28_4_ = iVar16;
  auVar29 = vpmulld_avx2(local_580,auVar27);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar30 = vpmulld_avx2(local_560,auVar61);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  auVar31 = vpmulld_avx2(local_580,auVar61);
  auVar30 = vpmulld_avx2(local_560,auVar57);
  auVar30 = vpaddd_avx2(auVar7,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  local_540 = vpsrad_avx2(auVar30,auVar67);
  local_9e0._4_4_ = iVar21;
  local_9e0._0_4_ = iVar21;
  local_9e0._8_4_ = iVar21;
  local_9e0._12_4_ = iVar21;
  local_9e0._16_4_ = iVar21;
  local_9e0._20_4_ = iVar21;
  local_9e0._24_4_ = iVar21;
  local_9e0._28_4_ = iVar21;
  auVar30 = vpmulld_avx2(local_5e0,auVar57);
  auVar31 = vpmulld_avx2(local_500,local_9e0);
  auVar30 = vpaddd_avx2(auVar30,auVar7);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  auVar32 = vpmulld_avx2(local_600,local_a00);
  auVar31 = vpmulld_avx2(local_4e0,auVar59);
  auVar31 = vpaddd_avx2(auVar7,auVar31);
  auVar31 = vpaddd_avx2(auVar32,auVar31);
  local_520 = vpsrad_avx2(auVar30,auVar67);
  local_4c0 = vpsrad_avx2(auVar31,auVar67);
  auVar30 = vpmulld_avx2(auVar59,local_8c0);
  auVar31 = vpmulld_avx2(local_480,auVar37);
  auVar30 = vpaddd_avx2(auVar30,auVar7);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_4a0 = vpsrad_avx2(auVar30,auVar67);
  local_640 = vpsrad_avx2(auVar2,auVar67);
  local_620 = vpsrad_avx2(auVar3,auVar67);
  local_5c0 = vpsrad_avx2(auVar26,auVar67);
  local_5a0 = vpsrad_avx2(auVar29,auVar67);
  auVar3._4_4_ = local_9a0;
  auVar3._0_4_ = local_9a0;
  auVar3._8_4_ = local_9a0;
  auVar3._12_4_ = local_9a0;
  auVar3._16_4_ = local_9a0;
  auVar3._20_4_ = local_9a0;
  auVar3._24_4_ = local_9a0;
  auVar3._28_4_ = local_9a0;
  auVar2._4_4_ = local_9c0;
  auVar2._0_4_ = local_9c0;
  auVar2._8_4_ = local_9c0;
  auVar2._12_4_ = local_9c0;
  auVar2._16_4_ = local_9c0;
  auVar2._20_4_ = local_9c0;
  auVar2._24_4_ = local_9c0;
  auVar2._28_4_ = local_9c0;
  for (uVar17 = 0x20; uVar17 < 0x40; uVar17 = uVar17 + 8) {
    auVar26 = vpaddd_avx2(pauVar13[-4],pauVar13[-7]);
    auVar30 = vpsubd_avx2(pauVar13[-7],pauVar13[-4]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-7] = auVar29;
    pauVar13[-4] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-5],pauVar13[-6]);
    auVar30 = vpsubd_avx2(pauVar13[-6],pauVar13[-5]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-6] = auVar29;
    pauVar13[-5] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-3],*pauVar13);
    auVar30 = vpsubd_avx2(*pauVar13,pauVar13[-3]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    *pauVar13 = auVar29;
    pauVar13[-3] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-2],pauVar13[-1]);
    auVar30 = vpsubd_avx2(pauVar13[-1],pauVar13[-2]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-1] = auVar29;
    pauVar13[-2] = auVar26;
    pauVar13 = pauVar13 + 8;
  }
  local_a60._4_4_ = local_b00;
  local_a60._0_4_ = local_b00;
  local_a60._8_4_ = local_b00;
  local_a60._12_4_ = local_b00;
  local_a60._16_4_ = local_b00;
  local_a60._20_4_ = local_b00;
  local_a60._24_4_ = local_b00;
  local_a60._28_4_ = local_b00;
  pauVar13 = &local_580;
  auVar26 = vpmulld_avx2(local_a60,(undefined1  [32])alVar12);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  local_a80 = (__m256i)vpsrad_avx2(auVar26,auVar67);
  local_840[0] = local_a80[0];
  local_840[1] = local_a80[1];
  local_840[2] = local_a80[2];
  local_840[3] = local_a80[3];
  local_860[0] = local_a80[0];
  local_860[1] = local_a80[1];
  local_860[2] = local_a80[2];
  local_860[3] = local_a80[3];
  local_7c0 = local_7e0;
  local_7a0 = local_780;
  auVar9._4_4_ = local_940;
  auVar9._0_4_ = local_940;
  auVar9._8_4_ = local_940;
  auVar9._12_4_ = local_940;
  auVar9._16_4_ = local_940;
  auVar9._20_4_ = local_940;
  auVar9._24_4_ = local_940;
  auVar9._28_4_ = local_940;
  auVar26 = vpmulld_avx2(local_760,auVar9);
  auVar10._4_4_ = local_920;
  auVar10._0_4_ = local_920;
  auVar10._8_4_ = local_920;
  auVar10._12_4_ = local_920;
  auVar10._16_4_ = local_920;
  auVar10._20_4_ = local_920;
  auVar10._24_4_ = local_920;
  auVar10._28_4_ = local_920;
  auVar29 = vpmulld_avx2(local_680,auVar10);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  local_740 = vpsrad_avx2(auVar26,auVar67);
  auVar26 = vpmulld_avx2(auVar10,local_760);
  auVar11._4_4_ = local_900;
  auVar11._0_4_ = local_900;
  auVar11._8_4_ = local_900;
  auVar11._12_4_ = local_900;
  auVar11._16_4_ = local_900;
  auVar11._20_4_ = local_900;
  auVar11._24_4_ = local_900;
  auVar11._28_4_ = local_900;
  auVar29 = vpmulld_avx2(auVar11,local_680);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  local_6a0 = vpsrad_avx2(auVar26,auVar67);
  local_a20._4_4_ = local_960;
  local_a20._0_4_ = local_960;
  local_a20._8_4_ = local_960;
  local_a20._12_4_ = local_960;
  local_a20._16_4_ = local_960;
  local_a20._20_4_ = local_960;
  local_a20._24_4_ = local_960;
  local_a20._28_4_ = local_960;
  auVar26 = vpmulld_avx2(local_700,local_a20);
  auVar29 = vpmulld_avx2(local_6e0,auVar9);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  local_720 = vpsrad_avx2(auVar26,auVar67);
  auVar26 = vpmulld_avx2(local_700,auVar9);
  auVar29 = vpmulld_avx2(local_6e0,auVar10);
  auVar26 = vpaddd_avx2(auVar26,auVar7);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  local_6c0 = vpsrad_avx2(auVar26,auVar67);
  for (uVar17 = 0x10; uVar17 < 0x20; uVar17 = uVar17 + 8) {
    auVar26 = vpaddd_avx2(pauVar13[-4],pauVar13[-7]);
    auVar30 = vpsubd_avx2(pauVar13[-7],pauVar13[-4]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-7] = auVar29;
    pauVar13[-4] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-5],pauVar13[-6]);
    auVar30 = vpsubd_avx2(pauVar13[-6],pauVar13[-5]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-6] = auVar29;
    pauVar13[-5] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-3],*pauVar13);
    auVar30 = vpsubd_avx2(*pauVar13,pauVar13[-3]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    *pauVar13 = auVar29;
    pauVar13[-3] = auVar26;
    auVar26 = vpaddd_avx2(pauVar13[-2],pauVar13[-1]);
    auVar30 = vpsubd_avx2(pauVar13[-1],pauVar13[-2]);
    auVar26 = vpmaxsd_avx2(auVar26,auVar3);
    auVar29 = vpminsd_avx2(auVar26,auVar2);
    auVar26 = vpmaxsd_avx2(auVar30,auVar3);
    auVar26 = vpminsd_avx2(auVar26,auVar2);
    pauVar13[-1] = auVar29;
    pauVar13[-2] = auVar26;
    pauVar13 = pauVar13 + 8;
  }
  puVar14 = local_460;
  auVar2 = vpmulld_avx2(local_420,local_a00);
  auVar3 = vpmulld_avx2(local_c0,auVar59);
  local_aa0 = vpaddd_avx2(auVar3,auVar2);
  auVar8._4_4_ = local_980;
  auVar8._0_4_ = local_980;
  auVar8._8_4_ = local_980;
  auVar8._12_4_ = local_980;
  auVar8._16_4_ = local_980;
  auVar8._20_4_ = local_980;
  auVar8._24_4_ = local_980;
  auVar8._28_4_ = local_980;
  auVar2 = vpmulld_avx2(local_400,local_a00);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar3 = vpmulld_avx2(local_e0,auVar59);
  local_ac0 = vpaddd_avx2(auVar2,auVar3);
  auVar2 = vpmulld_avx2(local_3e0,local_a40);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar3 = vpmulld_avx2(local_100,local_a00);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_3c0,local_a40);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar26 = vpmulld_avx2(local_120,local_a00);
  auVar3 = vpaddd_avx2(auVar26,auVar3);
  auVar26 = vpmulld_avx2(local_3c0,local_a00);
  auVar29 = vpmulld_avx2(local_120,auVar59);
  auVar26 = vpaddd_avx2(auVar8,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  local_120 = vpsrad_avx2(auVar26,auVar67);
  auVar26 = vpmulld_avx2(local_3e0,local_a00);
  auVar29 = vpmulld_avx2(local_100,auVar59);
  auVar26 = vpaddd_avx2(auVar8,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar29);
  auVar29 = vpmulld_avx2(local_400,auVar59);
  auVar30 = vpmulld_avx2(local_e0,auVar37);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_100 = vpsrad_avx2(auVar26,auVar67);
  local_e0 = vpsrad_avx2(auVar29,auVar67);
  auVar26 = vpmulld_avx2(local_420,auVar59);
  auVar29 = vpmulld_avx2(local_c0,auVar37);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  auVar26 = vpaddd_avx2(auVar8,auVar26);
  local_c0 = vpsrad_avx2(auVar26,auVar67);
  auVar26 = vpaddd_avx2(auVar8,local_aa0);
  local_420 = vpsrad_avx2(auVar26,auVar67);
  local_400 = vpsrad_avx2(local_ac0,auVar67);
  local_3e0 = vpsrad_avx2(auVar2,auVar67);
  local_3c0 = vpsrad_avx2(auVar3,auVar67);
  auVar2 = vpmulld_avx2(local_320,auVar61);
  auVar3 = vpmulld_avx2(local_1c0,auVar57);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_300,auVar61);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar26 = vpmulld_avx2(local_1e0,auVar57);
  auVar3 = vpaddd_avx2(auVar3,auVar26);
  auVar26 = vpmulld_avx2(local_2e0,auVar27);
  auVar26 = vpaddd_avx2(auVar8,auVar26);
  auVar29 = vpmulld_avx2(local_200,auVar61);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  auVar29 = vpmulld_avx2(local_2c0,auVar27);
  auVar29 = vpaddd_avx2(auVar29,auVar8);
  auVar30 = vpmulld_avx2(local_220,auVar61);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  auVar30 = vpmulld_avx2(local_2c0,auVar61);
  auVar31 = vpmulld_avx2(local_220,auVar57);
  auVar30 = vpaddd_avx2(auVar30,auVar8);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_220 = vpsrad_avx2(auVar30,auVar67);
  auVar30 = vpmulld_avx2(local_2e0,auVar61);
  auVar31 = vpmulld_avx2(local_200,auVar57);
  auVar30 = vpaddd_avx2(auVar8,auVar30);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_200 = vpsrad_avx2(auVar30,auVar67);
  auVar30 = vpmulld_avx2(local_300,auVar57);
  auVar31 = vpmulld_avx2(local_1e0,local_9e0);
  auVar30 = vpaddd_avx2(auVar8,auVar30);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  auVar31 = vpsrad_avx2(auVar2,auVar67);
  local_300 = vpsrad_avx2(auVar3,auVar67);
  local_2e0 = vpsrad_avx2(auVar26,auVar67);
  local_2c0 = vpsrad_avx2(auVar29,auVar67);
  auVar2 = vpmulld_avx2(local_320,auVar57);
  local_1e0 = vpsrad_avx2(auVar30,auVar67);
  auVar3 = vpmulld_avx2(local_9e0,local_1c0);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_1c0 = vpsrad_avx2(auVar2,auVar67);
  local_320 = auVar31;
  local_800 = local_a80[0];
  lStack_7f8 = local_a80[1];
  lStack_7f0 = local_a80[2];
  lStack_7e8 = local_a80[3];
  local_820 = local_a80[0];
  lStack_818 = local_a80[1];
  lStack_810 = local_a80[2];
  lStack_808 = local_a80[3];
  auVar4._4_4_ = local_b20;
  auVar4._0_4_ = local_b20;
  auVar4._8_4_ = local_b20;
  auVar4._12_4_ = local_b20;
  auVar4._16_4_ = local_b20;
  auVar4._20_4_ = local_b20;
  auVar4._24_4_ = local_b20;
  auVar4._28_4_ = local_b20;
  auVar2 = vpmulld_avx2(local_7e0,auVar4);
  auVar3 = vpmulld_avx2(local_780,local_a60);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_7c0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(local_780,local_7e0);
  auVar2 = vpmulld_avx2(auVar2,local_a60);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  local_7a0 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(local_700,local_760);
  auVar3 = vpsubd_avx2(local_760,local_700);
  auVar6._4_4_ = local_9a0;
  auVar6._0_4_ = local_9a0;
  auVar6._8_4_ = local_9a0;
  auVar6._12_4_ = local_9a0;
  auVar6._16_4_ = local_9a0;
  auVar6._20_4_ = local_9a0;
  auVar6._24_4_ = local_9a0;
  auVar6._28_4_ = local_9a0;
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  auVar5._4_4_ = local_9c0;
  auVar5._0_4_ = local_9c0;
  auVar5._8_4_ = local_9c0;
  auVar5._12_4_ = local_9c0;
  auVar5._16_4_ = local_9c0;
  auVar5._20_4_ = local_9c0;
  auVar5._24_4_ = local_9c0;
  auVar5._28_4_ = local_9c0;
  local_760 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_700 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_720,local_740);
  auVar3 = vpsubd_avx2(local_740,local_720);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_740 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_720 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6e0,local_680);
  auVar3 = vpsubd_avx2(local_680,local_6e0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_680 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6e0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6c0,local_6a0);
  auVar3 = vpsubd_avx2(local_6a0,local_6c0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_6a0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6c0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmulld_avx2(local_620,auVar9);
  auVar3 = vpmulld_avx2(local_4c0,auVar10);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_600,auVar9);
  auVar26 = vpmulld_avx2(local_4e0,auVar10);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar26);
  auVar26 = vpmulld_avx2(local_5e0,local_a20);
  auVar26 = vpaddd_avx2(auVar8,auVar26);
  auVar29 = vpmulld_avx2(local_500,auVar9);
  auVar26 = vpaddd_avx2(auVar29,auVar26);
  auVar30 = vpmulld_avx2(local_5c0,local_a20);
  auVar29 = vpmulld_avx2(local_5c0,auVar9);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar31 = vpmulld_avx2(local_520,auVar10);
  auVar29 = vpaddd_avx2(auVar31,auVar29);
  auVar31 = vpmulld_avx2(local_520,auVar9);
  auVar30 = vpaddd_avx2(auVar30,auVar8);
  local_520 = vpsrad_avx2(auVar29,auVar67);
  auVar29 = vpaddd_avx2(auVar30,auVar31);
  auVar30 = vpmulld_avx2(local_5e0,auVar9);
  auVar31 = vpmulld_avx2(local_500,auVar10);
  auVar30 = vpaddd_avx2(auVar8,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  local_500 = vpsrad_avx2(auVar30,auVar67);
  auVar30 = vpmulld_avx2(local_600,auVar10);
  auVar31 = vpmulld_avx2(local_4e0,auVar11);
  auVar30 = vpaddd_avx2(auVar8,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  local_4e0 = vpsrad_avx2(auVar30,auVar67);
  auVar30 = vpmulld_avx2(auVar10,local_620);
  auVar31 = vpmulld_avx2(auVar11,local_4c0);
  auVar30 = vpaddd_avx2(auVar8,auVar30);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  local_620 = vpsrad_avx2(auVar2,auVar67);
  local_600 = vpsrad_avx2(auVar3,auVar67);
  local_5e0 = vpsrad_avx2(auVar26,auVar67);
  local_5c0 = vpsrad_avx2(auVar29,auVar67);
  local_4c0 = vpsrad_avx2(auVar30,auVar67);
  for (uVar17 = 0x20; (uVar17 & 0xffffffc0) == 0; uVar17 = uVar17 + 0x10) {
    uVar20 = uVar17;
    for (lVar18 = 0; lVar18 != 0x80; lVar18 = lVar18 + 0x20) {
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar20 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar14 + lVar18));
      auVar26 = vpsubd_avx2(*(undefined1 (*) [32])(puVar14 + lVar18),
                            *(undefined1 (*) [32])(local_860 + (uVar20 ^ 7) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar26,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(puVar14 + lVar18) = auVar3;
      *(undefined1 (*) [32])(local_860 + (uVar20 ^ 7) * 4) = auVar2;
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar20 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar20 ^ 0xf) * 4));
      auVar26 = vpsubd_avx2(*(undefined1 (*) [32])(local_860 + (uVar20 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_860 + (uVar20 ^ 8) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar26,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(local_860 + (uVar20 ^ 0xf) * 4) = auVar3;
      *(undefined1 (*) [32])(local_860 + (uVar20 ^ 8) * 4) = auVar2;
      uVar20 = uVar20 + 1;
    }
    puVar14 = puVar14 + 0x200;
  }
  pauVar13 = (undefined1 (*) [32])local_860;
  for (lVar18 = 0xe0; lVar18 != 0x60; lVar18 = lVar18 + -0x20) {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])((long)local_860 + lVar18),*pauVar13);
    auVar26 = vpsubd_avx2(*pauVar13,*(undefined1 (*) [32])((long)local_860 + lVar18));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar26,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar13 = auVar3;
    *(undefined1 (*) [32])((long)local_860 + lVar18) = auVar2;
    pauVar13 = pauVar13 + 1;
  }
  iStack_b1c = local_b20;
  iStack_b18 = local_b20;
  iStack_b14 = local_b20;
  iStack_b10 = local_b20;
  iStack_b0c = local_b20;
  iStack_b08 = local_b20;
  iStack_b04 = local_b20;
  iStack_afc = local_b00;
  iStack_af8 = local_b00;
  iStack_af4 = local_b00;
  iStack_af0 = local_b00;
  iStack_aec = local_b00;
  iStack_ae8 = local_b00;
  iStack_ae4 = local_b00;
  iStack_9bc = local_9c0;
  iStack_9b8 = local_9c0;
  iStack_9b4 = local_9c0;
  iStack_9b0 = local_9c0;
  iStack_9ac = local_9c0;
  iStack_9a8 = local_9c0;
  iStack_9a4 = local_9c0;
  iStack_99c = local_9a0;
  iStack_998 = local_9a0;
  iStack_994 = local_9a0;
  iStack_990 = local_9a0;
  iStack_98c = local_9a0;
  iStack_988 = local_9a0;
  iStack_984 = local_9a0;
  iStack_97c = local_980;
  iStack_978 = local_980;
  iStack_974 = local_980;
  iStack_970 = local_980;
  iStack_96c = local_980;
  iStack_968 = local_980;
  iStack_964 = local_980;
  iStack_95c = local_960;
  iStack_958 = local_960;
  iStack_954 = local_960;
  iStack_950 = local_960;
  iStack_94c = local_960;
  iStack_948 = local_960;
  iStack_944 = local_960;
  iStack_93c = local_940;
  iStack_938 = local_940;
  iStack_934 = local_940;
  iStack_930 = local_940;
  iStack_92c = local_940;
  iStack_928 = local_940;
  iStack_924 = local_940;
  iStack_91c = local_920;
  iStack_918 = local_920;
  iStack_914 = local_920;
  iStack_910 = local_920;
  iStack_90c = local_920;
  iStack_908 = local_920;
  iStack_904 = local_920;
  iStack_8fc = local_900;
  iStack_8f8 = local_900;
  iStack_8f4 = local_900;
  iStack_8f0 = local_900;
  iStack_8ec = local_900;
  iStack_8e8 = local_900;
  iStack_8e4 = local_900;
  idct64_stage8_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_940,
                     (__m256i *)&local_920,(__m256i *)&local_900,(__m256i *)&local_960,
                     (__m256i *)&local_9a0,(__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage9_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_9a0,
                     (__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage10_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_9a0,
                      (__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage11_avx2(&local_860,out,do_cols,bd,out_shift,(__m256i *)&local_9a0,
                      (__m256i *)&local_9c0);
  return;
}

Assistant:

static void idct64_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi1 = _mm256_set1_epi32(cospi[1]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi3 = _mm256_set1_epi32(cospi[3]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi5 = _mm256_set1_epi32(cospi[5]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi7 = _mm256_set1_epi32(cospi[7]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi9 = _mm256_set1_epi32(cospi[9]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi11 = _mm256_set1_epi32(cospi[11]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi13 = _mm256_set1_epi32(cospi[13]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi15 = _mm256_set1_epi32(cospi[15]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi51 = _mm256_set1_epi32(cospi[51]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi55 = _mm256_set1_epi32(cospi[55]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi59 = _mm256_set1_epi32(cospi[59]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi63 = _mm256_set1_epi32(cospi[63]);

  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim12 = _mm256_set1_epi32(-cospi[12]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim28 = _mm256_set1_epi32(-cospi[28]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim44 = _mm256_set1_epi32(-cospi[44]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim49 = _mm256_set1_epi32(-cospi[49]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim53 = _mm256_set1_epi32(-cospi[53]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim57 = _mm256_set1_epi32(-cospi[57]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim60 = _mm256_set1_epi32(-cospi[60]);
  const __m256i cospim61 = _mm256_set1_epi32(-cospi[61]);

  {
    __m256i u[64];
    __m256i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_avx2(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_avx2(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_avx2(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_avx2(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_avx2(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_avx2(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_avx2(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_avx2(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_avx2(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_avx2(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_avx2(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_avx2(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_avx2(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_avx2(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_avx2(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_avx2(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_avx2(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_avx2(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_avx2(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_avx2(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_avx2(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_avx2(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_avx2(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_avx2(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_avx2(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_avx2(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_avx2(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_avx2(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_avx2(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_avx2(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_avx2(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_avx2(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_avx2(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_avx2(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_avx2(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_avx2(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_avx2(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_avx2(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_avx2(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_avx2(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_avx2(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_avx2(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_avx2(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_avx2(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                  &clamp_hi);

      addsub_avx2(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                  &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_avx2(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_avx2(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_avx2(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                  &clamp_hi);

      addsub_avx2(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                  &clamp_hi);
    }

    tmp1 = half_btf_avx2(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_avx2(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_avx2(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_avx2(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_avx2(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_avx2(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_avx2(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_avx2(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_avx2(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_avx2(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_avx2(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_avx2(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_avx2(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_avx2(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_avx2(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_avx2(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_avx2(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_avx2(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_avx2(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_avx2(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                    &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_avx2(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_avx2(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                       bit);

    // stage 10
    idct64_stage10_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                        bit);

    // stage 11
    idct64_stage11_avx2(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}